

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.cc
# Opt level: O0

float __thiscall webrtc::Agc::AnalyzePreproc(Agc *this,int16_t *audio,size_t length)

{
  float local_3c;
  float local_34;
  ulong local_30;
  size_t i;
  size_t num_clipped;
  size_t length_local;
  int16_t *audio_local;
  Agc *this_local;
  
  if (length != 0) {
    i = 0;
    for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
      if ((audio[local_30] == 0x7fff) || (audio[local_30] == -0x8000)) {
        i = i + 1;
      }
    }
    local_34 = (float)i;
    local_3c = (float)length;
    return local_34 / local_3c;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/agc.cc"
                ,0x2b,"virtual float webrtc::Agc::AnalyzePreproc(const int16_t *, size_t)");
}

Assistant:

float Agc::AnalyzePreproc(const int16_t* audio, size_t length) {
  assert(length > 0);
  size_t num_clipped = 0;
  for (size_t i = 0; i < length; ++i) {
    if (audio[i] == 32767 || audio[i] == -32768)
      ++num_clipped;
  }
  return 1.0f * num_clipped / length;
}